

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

Dims * adios2::utils::get_global_array_signature<unsigned_short>
                 (Dims *__return_storage_ptr__,Engine *fp,IO *io,Variable<unsigned_short> *variable)

{
  unsigned_long uVar1;
  pointer puVar2;
  long lVar3;
  undefined8 uVar4;
  void *pvVar5;
  _Rb_tree_node_base *p_Var6;
  size_type sVar7;
  size_t step;
  long lVar8;
  unsigned_long uVar9;
  bool bVar10;
  size_t step_1;
  size_type __n;
  allocator_type local_59;
  Dims *local_58;
  Variable<unsigned_short> *local_50;
  Dims d;
  
  __n = *(long *)(variable + 0x60) - *(long *)(variable + 0x58) >> 3;
  d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58 = __return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict1 *)&d,&local_59);
  if (timestep == '\x01') {
    adios2::core::VariableBase::Shape((ulong)&d);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (local_58,&d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  else {
    lVar3 = adios2::core::VariableBase::GetAvailableStepsCount();
    uVar4 = (**(code **)(*(long *)fp + 0x20))(fp);
    pvVar5 = (void *)(**(code **)(*(long *)fp + 0x58))(fp,variable,uVar4);
    local_50 = variable;
    if (pvVar5 == (void *)0x0) {
      p_Var6 = *(_Rb_tree_node_base **)(variable + 0x170);
      if (p_Var6 != (_Rb_tree_node_base *)(variable + 0x160)) {
        bVar10 = true;
        for (lVar8 = 0; lVar8 != lVar3; lVar8 = lVar8 + 1) {
          adios2::core::VariableBase::Shape
                    ((ulong)&d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          if (d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            puVar2 = (local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
              if (bVar10) {
                puVar2[sVar7] =
                     d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar7];
              }
              else if (puVar2[sVar7] !=
                       d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar7]) {
                puVar2[sVar7] = 0;
              }
            }
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            bVar10 = false;
          }
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        }
      }
    }
    else {
      bVar10 = true;
      for (lVar8 = 0; lVar8 != lVar3; lVar8 = lVar8 + 1) {
        if (lVar8 != 0) {
          pvVar5 = (void *)(**(code **)(*(long *)fp + 0x58))(fp,local_50,lVar8);
        }
        uVar1 = *(unsigned_long *)((long)pvVar5 + 0x10);
        if (uVar1 != 0) {
          puVar2 = (local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
            uVar9 = uVar1;
            if (*(char *)((long)pvVar5 + 8) == '\0') {
              uVar9 = *(unsigned_long *)(uVar1 + sVar7 * 8);
            }
            if (bVar10) {
LAB_00137a2d:
              puVar2[sVar7] = uVar9;
            }
            else if (puVar2[sVar7] != uVar9) {
              uVar9 = 0;
              goto LAB_00137a2d;
            }
          }
          bVar10 = false;
        }
        std::_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
        ~_Vector_base((_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                      ((long)pvVar5 + 0x20));
        operator_delete(pvVar5);
      }
    }
  }
  return local_58;
}

Assistant:

Dims get_global_array_signature(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    const size_t ndim = variable->m_Shape.size();
    Dims dims(ndim, 0);
    if (timestep)
    {
        dims = variable->Shape();
    }
    else
    {
        const size_t nsteps = variable->GetAvailableStepsCount();
        bool firstStep = true;

        // looping over the absolute step indexes
        // is not supported by a simple API function
        auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

        if (minBlocks)
        {
            for (size_t step = 0; step < nsteps; step++)
            {
                if (step > 0)
                {
                    minBlocks = fp->MinBlocksInfo(*variable, step);
                }
                if (minBlocks->Shape)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        size_t n =
                            (minBlocks->WasLocalValue ? reinterpret_cast<size_t>(minBlocks->Shape)
                                                      : minBlocks->Shape[k]);
                        if (firstStep)
                        {
                            dims[k] = n;
                        }
                        else if (dims[k] != n)
                        {
                            dims[k] = 0;
                        }
                    }
                    firstStep = false;
                }
                delete minBlocks;
            }
        }
        else
        {
            const std::map<size_t, std::vector<size_t>> &indices =
                variable->m_AvailableStepBlockIndexOffsets;
            auto itStep = indices.begin();
            if (itStep != indices.end())
            {
                for (size_t step = 0; step < nsteps; step++)
                {
                    const size_t absstep = itStep->first;
                    Dims d = variable->Shape(absstep - 1);
                    if (d.empty())
                    {
                        continue;
                    }

                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstStep)
                        {
                            dims[k] = d[k];
                        }
                        else if (dims[k] != d[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstStep = false;
                    ++itStep;
                }
            }
        }
    }
    return dims;
}